

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O1

int Fra_ClausCollectLatchClauses(Clu_Man_t *p,Fra_Sml_t *pSeq)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pObj1;
  Aig_Obj_t *pObj2;
  int iVar4;
  Aig_Man_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  int *piVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  Vec_Int_t *p_00;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  
  iVar1 = p->nSimWords;
  pSeq->nWordsPref = p->nSimWordsPref;
  pAVar5 = p->pAig;
  uVar8 = pAVar5->nObjs[2] - pAVar5->nRegs;
  pVVar6 = pAVar5->vCis;
  uVar13 = 0;
  uVar12 = 0;
  if (pVVar6->nSize <= (int)uVar8) {
LAB_0068954a:
    pSeq->nWordsPref = 0;
    if (p->fVerbose != 0) {
      printf("Collected %d register constants and %d one-hotness implications.\n",(ulong)uVar13,
             (ulong)uVar12);
    }
    p->nOneHots = uVar12 + uVar13;
    p->nOneHotsProven = 0;
    return 0;
  }
  iVar1 = iVar1 << 5;
  uVar9 = (ulong)uVar8;
  uVar12 = 0;
  uVar13 = 0;
LAB_0068928e:
  if ((int)uVar8 < 0) {
LAB_00689591:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pObj1 = (Aig_Obj_t *)pVVar6->pArray[uVar9];
  iVar2 = pSeq->nWordsTotal;
  iVar3 = pSeq->nWordsPref;
  if (iVar3 < iVar2) {
    lVar11 = 0;
    do {
      if (*(int *)((long)&pSeq[1].pAig +
                  lVar11 * 4 + (long)(iVar2 * pObj1->Id) * 4 + (long)iVar3 * 4) != 0) {
        uVar10 = pAVar5->nObjs[2] - pAVar5->nRegs;
        pVVar6 = p->pAig->vCis;
        if (pVVar6->nSize <= (int)uVar10) goto LAB_00689513;
        uVar14 = (ulong)uVar10;
        goto LAB_00689352;
      }
      lVar11 = lVar11 + 1;
    } while (iVar2 - iVar3 != (int)lVar11);
  }
  Vec_IntPush(p->vLits,p->pCnf->pVarNums[pObj1->Id] * 2 + 1);
  Vec_IntPush(p->vClauses,p->vLits->nSize);
  Vec_IntPush(p->vCosts,iVar1);
  uVar13 = uVar13 + 1;
  goto LAB_00689536;
LAB_00689352:
  do {
    if ((int)uVar10 < 0) goto LAB_00689591;
    pObj2 = (Aig_Obj_t *)pVVar6->pArray[uVar14];
    iVar2 = pObj2->Id;
    iVar3 = pSeq->nWordsTotal;
    iVar4 = Fra_ClausSmlNodesAreImp(pSeq,pObj1,pObj2);
    if (iVar4 == 0) {
      iVar4 = Fra_ClausSmlNodesAreImp(pSeq,pObj2,pObj1);
      if (iVar4 != 0) {
        Vec_IntPush(p->vLits,p->pCnf->pVarNums[iVar2] * 2 + 1);
        p_00 = p->vLits;
        piVar7 = p->pCnf->pVarNums;
        iVar2 = pObj1->Id;
        goto LAB_0068940e;
      }
      iVar4 = pSeq->nWordsPref;
      if (iVar4 < iVar3) {
        lVar11 = 0;
        do {
          if ((*(uint *)((long)&pSeq[1].pAig +
                        lVar11 * 4 + (long)(pObj1->Id * iVar3) * 4 + (long)iVar4 * 4) &
              *(uint *)((long)&pSeq[1].pAig +
                       lVar11 * 4 + (long)(iVar2 * iVar3) * 4 + (long)iVar4 * 4)) != 0)
          goto LAB_0068944e;
          lVar11 = lVar11 + 1;
        } while (iVar3 - iVar4 != (int)lVar11);
      }
      Vec_IntPush(p->vLits,p->pCnf->pVarNums[pObj1->Id] * 2 + 1);
      Vec_IntPush(p->vLits,p->pCnf->pVarNums[pObj2->Id] * 2 + 1);
    }
    else {
      Vec_IntPush(p->vLits,p->pCnf->pVarNums[pObj1->Id] * 2 + 1);
      p_00 = p->vLits;
      piVar7 = p->pCnf->pVarNums;
      iVar2 = pObj2->Id;
LAB_0068940e:
      Vec_IntPush(p_00,piVar7[iVar2] * 2);
    }
    Vec_IntPush(p->vClauses,p->vLits->nSize);
    Vec_IntPush(p->vCosts,iVar1);
    uVar12 = uVar12 + 1;
LAB_0068944e:
    uVar14 = uVar14 + 1;
    pVVar6 = p->pAig->vCis;
  } while ((int)uVar14 < pVVar6->nSize);
LAB_00689513:
  if (p->nClausesMax / 2 < (int)(uVar13 + uVar12)) goto LAB_0068954a;
LAB_00689536:
  uVar9 = uVar9 + 1;
  pAVar5 = p->pAig;
  pVVar6 = pAVar5->vCis;
  if (pVVar6->nSize <= (int)uVar9) goto LAB_0068954a;
  goto LAB_0068928e;
}

Assistant:

int Fra_ClausCollectLatchClauses( Clu_Man_t * p, Fra_Sml_t * pSeq )
{
    Aig_Obj_t * pObj1, * pObj2;
    unsigned * pSims1, * pSims2;
    int CostMax, i, k, nCountConst, nCountImps;

    nCountConst = nCountImps = 0;
    CostMax = p->nSimWords * 32;
/*
    // add the property
    {
        Aig_Obj_t * pObj;
        int Lits[1];
        pObj = Aig_ManCo( p->pAig, 0 );
        Lits[0] = toLitCond( p->pCnf->pVarNums[pObj->Id], 1 ); 
        Vec_IntPush( p->vLits, Lits[0] );
        Vec_IntPush( p->vClauses, Vec_IntSize(p->vLits) );
        Vec_IntPush( p->vCosts, CostMax );
        nCountConst++;
//        printf( "Added the target property to the set of clauses to be inductively checked.\n" );
    }
*/

    pSeq->nWordsPref = p->nSimWordsPref;
    Aig_ManForEachLoSeq( p->pAig, pObj1, i )
    {
        pSims1 = Fra_ObjSim( pSeq, pObj1->Id );
        if ( Fra_ClausSmlNodeIsConst( pSeq, pObj1 ) )
        {
            Vec_IntPush( p->vLits, toLitCond( p->pCnf->pVarNums[pObj1->Id], 1 ) );
            Vec_IntPush( p->vClauses, Vec_IntSize(p->vLits) );
            Vec_IntPush( p->vCosts, CostMax );
            nCountConst++;
            continue;
        }
        Aig_ManForEachLoSeq( p->pAig, pObj2, k )
        {
            pSims2 = Fra_ObjSim( pSeq, pObj2->Id );
            if ( Fra_ClausSmlNodesAreImp( pSeq, pObj1, pObj2 ) )
            {
                Vec_IntPush( p->vLits, toLitCond( p->pCnf->pVarNums[pObj1->Id], 1 ) );
                Vec_IntPush( p->vLits, toLitCond( p->pCnf->pVarNums[pObj2->Id], 0 ) );
                Vec_IntPush( p->vClauses, Vec_IntSize(p->vLits) );
                Vec_IntPush( p->vCosts, CostMax );
                nCountImps++;
                continue;
            }
            if ( Fra_ClausSmlNodesAreImp( pSeq, pObj2, pObj1 ) )
            {
                Vec_IntPush( p->vLits, toLitCond( p->pCnf->pVarNums[pObj2->Id], 1 ) );
                Vec_IntPush( p->vLits, toLitCond( p->pCnf->pVarNums[pObj1->Id], 0 ) );
                Vec_IntPush( p->vClauses, Vec_IntSize(p->vLits) );
                Vec_IntPush( p->vCosts, CostMax );
                nCountImps++;
                continue;
            }
            if ( Fra_ClausSmlNodesAreImpC( pSeq, pObj1, pObj2 ) )
            {
                Vec_IntPush( p->vLits, toLitCond( p->pCnf->pVarNums[pObj1->Id], 1 ) );
                Vec_IntPush( p->vLits, toLitCond( p->pCnf->pVarNums[pObj2->Id], 1 ) );
                Vec_IntPush( p->vClauses, Vec_IntSize(p->vLits) );
                Vec_IntPush( p->vCosts, CostMax );
                nCountImps++;
                continue;
            }
        }
        if ( nCountConst + nCountImps > p->nClausesMax / 2 )
            break;
    }
    pSeq->nWordsPref = 0;
    if ( p->fVerbose )
    printf( "Collected %d register constants and %d one-hotness implications.\n", nCountConst, nCountImps );
    p->nOneHots = nCountConst + nCountImps;
    p->nOneHotsProven = 0;
    return 0;
}